

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  long *in_FS_OFFSET;
  void *local_28;
  void *p;
  pthread_t thread2;
  pthread_t thread1;
  
  thread1._4_4_ = 0;
  printf("%s, %p, %i\n","main",*in_FS_OFFSET + -4,(ulong)*(uint *)(*in_FS_OFFSET + -4));
  pthread_create(&thread2,(pthread_attr_t *)0x0,f,(void *)0x0);
  pthread_join(thread2,&local_28);
  printf("%s, %p, %i\n","main",*in_FS_OFFSET + -4,(ulong)*(uint *)(*in_FS_OFFSET + -4));
  pthread_create((pthread_t *)&p,(pthread_attr_t *)0x0,f,(void *)0x0);
  pthread_join((pthread_t)p,&local_28);
  printf("%s, %p, %i\n","main",*in_FS_OFFSET + -4,(ulong)*(uint *)(*in_FS_OFFSET + -4));
  return 0;
}

Assistant:

int
main()
{
    pthread_t thread1;
    pthread_t thread2;
    printf("%s, %p, %i\n", __func__, &thread_i, thread_i);
    pthread_create(&thread1, NULL, f, NULL);
    void *p;
    pthread_join(thread1, &p);
    printf("%s, %p, %i\n", __func__, &thread_i, thread_i);
    pthread_create(&thread2, NULL, f, NULL);
    pthread_join(thread2, &p);
    printf("%s, %p, %i\n", __func__, &thread_i, thread_i);
    return 0;
}